

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Vat * __thiscall capnp::_::anon_unknown_0::TestContext::getVat(TestContext *this,StringPtr name)

{
  HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>
  *this_00;
  StringPtr name_00;
  TestVat *network;
  Vat *pVVar1;
  Entry *pEVar2;
  ArrayPtr<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Entry>
  table;
  bool success;
  StringPtr name_local;
  size_t pos;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
  local_70;
  Entry local_48;
  
  name_local.content.size_ = name.content.size_;
  name_local.content.ptr = name.content.ptr;
  this_00 = &this->vats;
  pEVar2 = (this->vats).table.rows.builder.ptr;
  pos = (long)(this->vats).table.rows.builder.pos - (long)pEVar2 >> 5;
  table.size_ = (size_t)pEVar2;
  table.ptr = (Entry *)&(this->vats).table.indexes;
  kj::
  HashIndex<kj::HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>::Callbacks>
  ::
  insert<kj::HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>::Entry,kj::StringPtr&>
            ((HashIndex<kj::HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>::Callbacks>
              *)&local_70,table,pos,(StringPtr *)pos);
  if ((HashIndex<kj::HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>::Callbacks>
       )local_70.maybeFunc.ptr.isSet ==
      (HashIndex<kj::HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>::Callbacks>
       )0x1) {
    pEVar2 = (this_00->table).rows.builder.ptr + (long)local_70.maybeFunc.ptr.field_1.value.success;
  }
  else {
    local_70.maybeFunc.ptr.field_1.value.success = &success;
    success = false;
    local_70.maybeFunc.ptr.isSet = true;
    local_70.maybeFunc.ptr.field_1.value.pos = &pos;
    local_48.key.content.ptr = name_local.content.ptr;
    local_48.key.content.size_ = name_local.content.size_;
    name_00.content.size_ = name_local.content.size_;
    name_00.content.ptr = name_local.content.ptr;
    local_70.maybeFunc.ptr.field_1.value.table = &this_00->table;
    local_70.maybeFunc.ptr.field_1.value.params = &name_local;
    network = TestNetwork::add(&this->network,name_00);
    pVVar1 = (Vat *)operator_new(0x18);
    pVVar1->vatNetwork = network;
    makeRpcClient<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
              ((capnp *)&pVVar1->rpcSystem,&network->super_TestVatBase);
    local_48.value.disposer =
         (Disposer *)
         &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestContext::Vat>::instance;
    local_48.value.ptr = pVVar1;
    pEVar2 = kj::
             Vector<kj::HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>::Entry>
             ::
             add<kj::HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>::Entry>
                       ((Vector<kj::HashMap<kj::StringPtr,kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,decltype(nullptr)>>::Entry>
                         *)this_00,&local_48);
    if (local_48.value.ptr != (Vat *)0x0) {
      (**(local_48.value.disposer)->_vptr_Disposer)();
    }
    success = true;
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:615:7)>
    ::~Deferred(&local_70);
  }
  return (pEVar2->value).ptr;
}

Assistant:

Vat& getVat(kj::StringPtr name) {
    // Get or create a vat with the given name. (Name must be a string literal or otherwise
    // outlive the TestContext.)
    return *vats.findOrCreate(name, [&]() -> decltype(vats)::Entry {
      return { name,  kj::heap<Vat>(network.add(name)) };
    });
  }